

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdFreePsbtByteDataList(void *handle,void *data_list_handle)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this;
  string local_48;
  
  cfd::Initialize();
  if (data_list_handle != (void *)0x0) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PsbtDataList","");
    cfd::capi::CheckBuffer(data_list_handle,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    this = *(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> **)
            ((long)data_list_handle + 0x10);
    if (this != (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)0x0) {
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(this);
      operator_delete(this);
      *(undefined8 *)((long)data_list_handle + 0x10) = 0;
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"PsbtDataList","");
    cfd::capi::FreeBuffer(data_list_handle,&local_48,0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return 0;
}

Assistant:

int CfdFreePsbtByteDataList(void* handle, void* data_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (data_list_handle != nullptr) {
      CheckBuffer(data_list_handle, kPrefixPsbtByteDataList);
      CfdCapiPsbtByteDataListHandle* list_handle =
          static_cast<CfdCapiPsbtByteDataListHandle*>(data_list_handle);
      if (list_handle->data_list != nullptr) {
        delete list_handle->data_list;
        list_handle->data_list = nullptr;
      }
      FreeBuffer(
          data_list_handle, kPrefixPsbtByteDataList,
          sizeof(CfdCapiPsbtByteDataListHandle));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}